

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  __m128i *palVar20;
  __m128i *ptr;
  __m128i *ptr_00;
  int16_t *ptr_01;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int32_t segNum;
  long lVar26;
  __m128i *ptr_02;
  uint uVar27;
  uint uVar28;
  int iVar29;
  int16_t iVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  undefined2 uVar36;
  int iVar37;
  uint uVar38;
  ulong size;
  bool bVar39;
  undefined4 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  short sVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar51;
  undefined1 auVar52 [16];
  ulong uVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ushort uVar66;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar78;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  int local_11c;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar40;
  short sVar45;
  short sVar77;
  short sVar79;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_sg_flags_table_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse2_128_16_cold_4();
        }
        else {
          uVar25 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_16_cold_1();
          }
          else {
            iVar14 = uVar17 - 1;
            uVar53 = (ulong)uVar17 + 7;
            size = uVar53 >> 3;
            uVar38 = (uint)size;
            iVar37 = iVar14 / (int)uVar38;
            uVar27 = -open;
            uVar28 = ppVar4->min;
            iVar18 = -uVar28;
            if (uVar28 != uVar27 && SBORROW4(uVar28,uVar27) == (int)(uVar28 + open) < 0) {
              iVar18 = open;
            }
            iVar29 = ppVar4->max;
            ppVar19 = parasail_result_new_table1((uint)uVar53 & 0x7ffffff8,s2Len);
            if (ppVar19 != (parasail_result_t *)0x0) {
              ppVar19->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar19->flag | 0x8220802;
              palVar20 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar20 != (__m128i *)0x0)) {
                iVar15 = s2Len + -1;
                uVar22 = 7 - iVar37;
                auVar42 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar41 = auVar42._0_4_;
                auVar52._4_4_ = uVar41;
                auVar52._0_4_ = uVar41;
                auVar52._8_4_ = uVar41;
                auVar52._12_4_ = uVar41;
                auVar42 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar41 = auVar42._0_4_;
                uVar35 = iVar18 - 0x7fff;
                auVar42 = pshuflw(ZEXT416(uVar35),ZEXT416(uVar35),0);
                auVar43._0_4_ = auVar42._0_4_;
                auVar43._4_4_ = auVar43._0_4_;
                auVar43._8_4_ = auVar43._0_4_;
                auVar43._12_4_ = auVar43._0_4_;
                auVar46 = ZEXT416(CONCAT22((short)(uVar28 >> 0x10),0x7ffe - (short)iVar29));
                auVar46 = pshuflw(auVar46,auVar46,0);
                auVar47._0_4_ = auVar46._0_4_;
                auVar47._4_4_ = auVar47._0_4_;
                auVar47._8_4_ = auVar47._0_4_;
                auVar47._12_4_ = auVar47._0_4_;
                auVar49 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
                sVar54 = auVar49._0_2_;
                sVar40 = auVar49._2_2_;
                lVar23 = (long)(int)uVar27;
                uVar31 = 0;
                do {
                  lVar26 = 0;
                  lVar33 = lVar23;
                  do {
                    lVar32 = lVar33;
                    if (s1_beg != 0) {
                      lVar32 = 0;
                    }
                    uVar36 = 0x8000;
                    if (-0x8000 < lVar32) {
                      uVar36 = (undefined2)lVar32;
                    }
                    *(undefined2 *)((long)&local_48 + lVar26 * 2) = uVar36;
                    lVar32 = lVar32 - (ulong)(uint)open;
                    if (lVar32 < -0x7fff) {
                      lVar32 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar26 * 2) = (short)lVar32;
                    lVar26 = lVar26 + 1;
                    lVar33 = lVar33 - size * (uint)gap;
                  } while (lVar26 != 8);
                  palVar20[uVar31][0] = local_48;
                  palVar20[uVar31][1] = lStack_40;
                  ptr_00[uVar31][0] = local_58;
                  ptr_00[uVar31][1] = lStack_50;
                  uVar31 = uVar31 + 1;
                  lVar23 = lVar23 - (ulong)(uint)gap;
                } while (uVar31 != size);
                uVar31 = 1;
                if (1 < s2Len) {
                  uVar31 = uVar25;
                }
                *ptr_01 = 0;
                uVar24 = 0;
                uVar28 = uVar27;
                do {
                  iVar30 = -0x8000;
                  if (-0x8000 < (int)uVar28) {
                    iVar30 = (int16_t)uVar28;
                  }
                  if (s2_beg != 0) {
                    iVar30 = 0;
                  }
                  ptr_01[uVar24 + 1] = iVar30;
                  uVar28 = uVar28 - gap;
                  uVar24 = uVar24 + 1;
                } while (uVar31 != uVar24);
                uVar31 = 1;
                if (1 < s2Len) {
                  uVar31 = uVar25;
                }
                lVar23 = size * uVar25;
                lVar33 = (ulong)(uVar38 + (uVar38 == 0)) << 4;
                lVar26 = 0;
                uVar24 = 0;
                auVar49 = auVar43;
                auVar64 = auVar43;
                local_11c = iVar15;
                do {
                  ptr_02 = ptr;
                  ptr = palVar20;
                  iVar18 = ppVar4->mapper[(byte)s2[uVar24]];
                  uVar21 = ptr[uVar38 - 1][0];
                  auVar80._8_8_ = ptr[uVar38 - 1][1] << 0x10 | uVar21 >> 0x30;
                  auVar80._0_8_ = uVar21 << 0x10 | (ulong)(ushort)ptr_01[uVar24];
                  lVar34 = 0;
                  lVar32 = lVar26;
                  auVar50 = auVar49;
                  auVar63 = auVar43;
                  do {
                    auVar49 = paddsw(auVar80,*(undefined1 (*) [16])
                                              ((long)pvVar3 + lVar34 + size * (long)iVar18 * 0x10));
                    auVar80 = *(undefined1 (*) [16])((long)*ptr_00 + lVar34);
                    sVar45 = auVar63._0_2_;
                    sVar56 = auVar80._0_2_;
                    uVar66 = (ushort)(sVar56 < sVar45) * sVar45 |
                             (ushort)(sVar56 >= sVar45) * sVar56;
                    sVar6 = auVar63._2_2_;
                    sVar57 = auVar80._2_2_;
                    uVar71 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57;
                    sVar7 = auVar63._4_2_;
                    sVar58 = auVar80._4_2_;
                    uVar72 = (ushort)(sVar58 < sVar7) * sVar7 | (ushort)(sVar58 >= sVar7) * sVar58;
                    sVar8 = auVar63._6_2_;
                    sVar59 = auVar80._6_2_;
                    uVar73 = (ushort)(sVar59 < sVar8) * sVar8 | (ushort)(sVar59 >= sVar8) * sVar59;
                    sVar9 = auVar63._8_2_;
                    sVar60 = auVar80._8_2_;
                    uVar74 = (ushort)(sVar60 < sVar9) * sVar9 | (ushort)(sVar60 >= sVar9) * sVar60;
                    sVar10 = auVar63._10_2_;
                    sVar61 = auVar80._10_2_;
                    uVar75 = (ushort)(sVar61 < sVar10) * sVar10 |
                             (ushort)(sVar61 >= sVar10) * sVar61;
                    sVar11 = auVar63._12_2_;
                    sVar77 = auVar80._12_2_;
                    sVar79 = auVar80._14_2_;
                    uVar76 = (ushort)(sVar77 < sVar11) * sVar11 |
                             (ushort)(sVar77 >= sVar11) * sVar77;
                    sVar55 = auVar63._14_2_;
                    uVar78 = (ushort)(sVar79 < sVar55) * sVar55 |
                             (ushort)(sVar79 >= sVar55) * sVar79;
                    sVar48 = auVar49._0_2_;
                    auVar67._0_2_ =
                         (ushort)((short)uVar66 < sVar48) * sVar48 |
                         ((short)uVar66 >= sVar48) * uVar66;
                    sVar48 = auVar49._2_2_;
                    auVar67._2_2_ =
                         (ushort)((short)uVar71 < sVar48) * sVar48 |
                         ((short)uVar71 >= sVar48) * uVar71;
                    sVar48 = auVar49._4_2_;
                    auVar67._4_2_ =
                         (ushort)((short)uVar72 < sVar48) * sVar48 |
                         ((short)uVar72 >= sVar48) * uVar72;
                    sVar48 = auVar49._6_2_;
                    auVar67._6_2_ =
                         (ushort)((short)uVar73 < sVar48) * sVar48 |
                         ((short)uVar73 >= sVar48) * uVar73;
                    sVar48 = auVar49._8_2_;
                    auVar67._8_2_ =
                         (ushort)((short)uVar74 < sVar48) * sVar48 |
                         ((short)uVar74 >= sVar48) * uVar74;
                    sVar48 = auVar49._10_2_;
                    auVar67._10_2_ =
                         (ushort)((short)uVar75 < sVar48) * sVar48 |
                         ((short)uVar75 >= sVar48) * uVar75;
                    sVar48 = auVar49._12_2_;
                    auVar67._12_2_ =
                         (ushort)((short)uVar76 < sVar48) * sVar48 |
                         ((short)uVar76 >= sVar48) * uVar76;
                    sVar48 = auVar49._14_2_;
                    auVar67._14_2_ =
                         (ushort)((short)uVar78 < sVar48) * sVar48 |
                         ((short)uVar78 >= sVar48) * uVar78;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar34) = auVar67;
                    piVar5 = ((ppVar19->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar32) = (int)(short)auVar67._0_2_;
                    *(int *)((long)piVar5 + lVar23 * 4 + lVar32) = (int)(short)auVar67._2_2_;
                    *(int *)((long)piVar5 + lVar23 * 8 + lVar32) = (int)(short)auVar67._4_2_;
                    *(int *)((long)piVar5 + lVar23 * 0xc + lVar32) = (int)(short)auVar67._6_2_;
                    *(int *)((long)piVar5 + lVar23 * 0x10 + lVar32) = (int)(short)auVar67._8_2_;
                    *(int *)((long)piVar5 + lVar23 * 0x14 + lVar32) = (int)(short)auVar67._10_2_;
                    *(int *)((long)piVar5 + lVar23 * 0x18 + lVar32) = (int)(short)auVar67._12_2_;
                    *(int *)((long)piVar5 + lVar23 * 0x1c + lVar32) = (int)(short)auVar67._14_2_;
                    sVar48 = auVar50._0_2_;
                    auVar49._0_2_ =
                         (sVar48 < (short)auVar67._0_2_) * auVar67._0_2_ |
                         (ushort)(sVar48 >= (short)auVar67._0_2_) * sVar48;
                    sVar48 = auVar50._2_2_;
                    auVar49._2_2_ =
                         (sVar48 < (short)auVar67._2_2_) * auVar67._2_2_ |
                         (ushort)(sVar48 >= (short)auVar67._2_2_) * sVar48;
                    sVar48 = auVar50._4_2_;
                    auVar49._4_2_ =
                         (sVar48 < (short)auVar67._4_2_) * auVar67._4_2_ |
                         (ushort)(sVar48 >= (short)auVar67._4_2_) * sVar48;
                    sVar48 = auVar50._6_2_;
                    auVar49._6_2_ =
                         (sVar48 < (short)auVar67._6_2_) * auVar67._6_2_ |
                         (ushort)(sVar48 >= (short)auVar67._6_2_) * sVar48;
                    sVar48 = auVar50._8_2_;
                    auVar49._8_2_ =
                         (sVar48 < (short)auVar67._8_2_) * auVar67._8_2_ |
                         (ushort)(sVar48 >= (short)auVar67._8_2_) * sVar48;
                    sVar48 = auVar50._10_2_;
                    auVar49._10_2_ =
                         (sVar48 < (short)auVar67._10_2_) * auVar67._10_2_ |
                         (ushort)(sVar48 >= (short)auVar67._10_2_) * sVar48;
                    sVar48 = auVar50._12_2_;
                    sVar51 = auVar50._14_2_;
                    auVar49._12_2_ =
                         (sVar48 < (short)auVar67._12_2_) * auVar67._12_2_ |
                         (ushort)(sVar48 >= (short)auVar67._12_2_) * sVar48;
                    auVar49._14_2_ =
                         (sVar51 < (short)auVar67._14_2_) * auVar67._14_2_ |
                         (ushort)(sVar51 >= (short)auVar67._14_2_) * sVar51;
                    sVar48 = auVar47._0_2_;
                    uVar66 = (ushort)(sVar56 < sVar48) * sVar56 |
                             (ushort)(sVar56 >= sVar48) * sVar48;
                    sVar48 = auVar47._2_2_;
                    uVar71 = (ushort)(sVar57 < sVar48) * sVar57 |
                             (ushort)(sVar57 >= sVar48) * sVar48;
                    sVar48 = auVar47._4_2_;
                    uVar72 = (ushort)(sVar58 < sVar48) * sVar58 |
                             (ushort)(sVar58 >= sVar48) * sVar48;
                    sVar48 = auVar47._6_2_;
                    uVar73 = (ushort)(sVar59 < sVar48) * sVar59 |
                             (ushort)(sVar59 >= sVar48) * sVar48;
                    sVar48 = auVar47._8_2_;
                    uVar74 = (ushort)(sVar60 < sVar48) * sVar60 |
                             (ushort)(sVar60 >= sVar48) * sVar48;
                    sVar48 = auVar47._10_2_;
                    uVar75 = (ushort)(sVar61 < sVar48) * sVar61 |
                             (ushort)(sVar61 >= sVar48) * sVar48;
                    sVar48 = auVar47._12_2_;
                    sVar51 = auVar47._14_2_;
                    uVar76 = (ushort)(sVar77 < sVar48) * sVar77 |
                             (ushort)(sVar77 >= sVar48) * sVar48;
                    uVar78 = (ushort)(sVar79 < sVar51) * sVar79 |
                             (ushort)(sVar79 >= sVar51) * sVar51;
                    uVar66 = (ushort)(sVar45 < (short)uVar66) * sVar45 |
                             (sVar45 >= (short)uVar66) * uVar66;
                    uVar71 = (ushort)(sVar6 < (short)uVar71) * sVar6 |
                             (sVar6 >= (short)uVar71) * uVar71;
                    uVar72 = (ushort)(sVar7 < (short)uVar72) * sVar7 |
                             (sVar7 >= (short)uVar72) * uVar72;
                    uVar73 = (ushort)(sVar8 < (short)uVar73) * sVar8 |
                             (sVar8 >= (short)uVar73) * uVar73;
                    uVar74 = (ushort)(sVar9 < (short)uVar74) * sVar9 |
                             (sVar9 >= (short)uVar74) * uVar74;
                    uVar75 = (ushort)(sVar10 < (short)uVar75) * sVar10 |
                             (sVar10 >= (short)uVar75) * uVar75;
                    uVar76 = (ushort)(sVar11 < (short)uVar76) * sVar11 |
                             (sVar11 >= (short)uVar76) * uVar76;
                    uVar78 = (ushort)(sVar55 < (short)uVar78) * sVar55 |
                             (sVar55 >= (short)uVar78) * uVar78;
                    auVar47._0_2_ =
                         ((short)auVar67._0_2_ < (short)uVar66) * auVar67._0_2_ |
                         ((short)auVar67._0_2_ >= (short)uVar66) * uVar66;
                    auVar47._2_2_ =
                         ((short)auVar67._2_2_ < (short)uVar71) * auVar67._2_2_ |
                         ((short)auVar67._2_2_ >= (short)uVar71) * uVar71;
                    auVar47._4_2_ =
                         ((short)auVar67._4_2_ < (short)uVar72) * auVar67._4_2_ |
                         ((short)auVar67._4_2_ >= (short)uVar72) * uVar72;
                    auVar47._6_2_ =
                         ((short)auVar67._6_2_ < (short)uVar73) * auVar67._6_2_ |
                         ((short)auVar67._6_2_ >= (short)uVar73) * uVar73;
                    auVar47._8_2_ =
                         ((short)auVar67._8_2_ < (short)uVar74) * auVar67._8_2_ |
                         ((short)auVar67._8_2_ >= (short)uVar74) * uVar74;
                    auVar47._10_2_ =
                         ((short)auVar67._10_2_ < (short)uVar75) * auVar67._10_2_ |
                         ((short)auVar67._10_2_ >= (short)uVar75) * uVar75;
                    auVar47._12_2_ =
                         ((short)auVar67._12_2_ < (short)uVar76) * auVar67._12_2_ |
                         ((short)auVar67._12_2_ >= (short)uVar76) * uVar76;
                    auVar47._14_2_ =
                         ((short)auVar67._14_2_ < (short)uVar78) * auVar67._14_2_ |
                         ((short)auVar67._14_2_ >= (short)uVar78) * uVar78;
                    auVar68 = psubsw(auVar67,auVar52);
                    auVar50._4_4_ = uVar41;
                    auVar50._0_4_ = uVar41;
                    auVar50._8_4_ = uVar41;
                    auVar50._12_4_ = uVar41;
                    auVar80 = psubsw(auVar80,auVar50);
                    sVar45 = auVar68._0_2_;
                    sVar55 = auVar80._0_2_;
                    sVar48 = auVar68._2_2_;
                    sVar51 = auVar80._2_2_;
                    sVar6 = auVar68._4_2_;
                    sVar56 = auVar80._4_2_;
                    sVar7 = auVar68._6_2_;
                    sVar57 = auVar80._6_2_;
                    sVar8 = auVar68._8_2_;
                    sVar58 = auVar80._8_2_;
                    sVar9 = auVar68._10_2_;
                    sVar59 = auVar80._10_2_;
                    sVar10 = auVar68._12_2_;
                    sVar60 = auVar80._12_2_;
                    sVar61 = auVar80._14_2_;
                    sVar11 = auVar68._14_2_;
                    puVar1 = (ushort *)((long)*ptr_00 + lVar34);
                    *puVar1 = (ushort)(sVar55 < sVar45) * sVar45 |
                              (ushort)(sVar55 >= sVar45) * sVar55;
                    puVar1[1] = (ushort)(sVar51 < sVar48) * sVar48 |
                                (ushort)(sVar51 >= sVar48) * sVar51;
                    puVar1[2] = (ushort)(sVar56 < sVar6) * sVar6 |
                                (ushort)(sVar56 >= sVar6) * sVar56;
                    puVar1[3] = (ushort)(sVar57 < sVar7) * sVar7 |
                                (ushort)(sVar57 >= sVar7) * sVar57;
                    puVar1[4] = (ushort)(sVar58 < sVar8) * sVar8 |
                                (ushort)(sVar58 >= sVar8) * sVar58;
                    puVar1[5] = (ushort)(sVar59 < sVar9) * sVar9 |
                                (ushort)(sVar59 >= sVar9) * sVar59;
                    puVar1[6] = (ushort)(sVar60 < sVar10) * sVar10 |
                                (ushort)(sVar60 >= sVar10) * sVar60;
                    puVar1[7] = (ushort)(sVar61 < sVar11) * sVar11 |
                                (ushort)(sVar61 >= sVar11) * sVar61;
                    auVar68._4_4_ = uVar41;
                    auVar68._0_4_ = uVar41;
                    auVar68._8_4_ = uVar41;
                    auVar68._12_4_ = uVar41;
                    auVar80 = psubsw(auVar63,auVar68);
                    sVar55 = auVar80._0_2_;
                    auVar63._0_2_ =
                         (ushort)(sVar55 < sVar45) * sVar45 | (ushort)(sVar55 >= sVar45) * sVar55;
                    sVar45 = auVar80._2_2_;
                    auVar63._2_2_ =
                         (ushort)(sVar45 < sVar48) * sVar48 | (ushort)(sVar45 >= sVar48) * sVar45;
                    sVar45 = auVar80._4_2_;
                    auVar63._4_2_ =
                         (ushort)(sVar45 < sVar6) * sVar6 | (ushort)(sVar45 >= sVar6) * sVar45;
                    sVar45 = auVar80._6_2_;
                    auVar63._6_2_ =
                         (ushort)(sVar45 < sVar7) * sVar7 | (ushort)(sVar45 >= sVar7) * sVar45;
                    sVar45 = auVar80._8_2_;
                    auVar63._8_2_ =
                         (ushort)(sVar45 < sVar8) * sVar8 | (ushort)(sVar45 >= sVar8) * sVar45;
                    sVar45 = auVar80._10_2_;
                    auVar63._10_2_ =
                         (ushort)(sVar45 < sVar9) * sVar9 | (ushort)(sVar45 >= sVar9) * sVar45;
                    sVar45 = auVar80._12_2_;
                    sVar48 = auVar80._14_2_;
                    auVar63._12_2_ =
                         (ushort)(sVar45 < sVar10) * sVar10 | (ushort)(sVar45 >= sVar10) * sVar45;
                    auVar63._14_2_ =
                         (ushort)(sVar48 < sVar11) * sVar11 | (ushort)(sVar48 >= sVar11) * sVar48;
                    auVar80 = *(undefined1 (*) [16])((long)*ptr + lVar34);
                    lVar34 = lVar34 + 0x10;
                    lVar32 = lVar32 + uVar25 * 4;
                    auVar50 = auVar49;
                  } while (lVar33 != lVar34);
                  uVar28 = 0;
                  do {
                    uVar16 = uVar27;
                    if (s2_beg == 0) {
                      uVar16 = ptr_01[uVar24 + 1] - open;
                    }
                    uVar62 = auVar63._0_8_;
                    auVar63._8_8_ = auVar63._8_8_ << 0x10 | uVar62 >> 0x30;
                    uVar21 = (ulong)uVar16;
                    if ((int)uVar16 < -0x7fff) {
                      uVar21 = 0xffff8000;
                    }
                    auVar63._0_8_ = uVar62 << 0x10 | uVar21 & 0xffff;
                    bVar39 = true;
                    uVar21 = 1;
                    lVar34 = 0;
                    lVar32 = lVar26;
                    auVar80 = auVar49;
                    auVar50 = auVar47;
                    do {
                      psVar2 = (short *)((long)*ptr_02 + lVar34);
                      sVar48 = *psVar2;
                      sVar6 = psVar2[1];
                      sVar7 = psVar2[2];
                      sVar8 = psVar2[3];
                      sVar9 = psVar2[4];
                      sVar10 = psVar2[5];
                      sVar11 = psVar2[6];
                      sVar55 = psVar2[7];
                      sVar45 = auVar63._0_2_;
                      auVar69._0_2_ =
                           (ushort)(sVar48 < sVar45) * sVar45 | (ushort)(sVar48 >= sVar45) * sVar48;
                      sVar45 = auVar63._2_2_;
                      auVar69._2_2_ =
                           (ushort)(sVar6 < sVar45) * sVar45 | (ushort)(sVar6 >= sVar45) * sVar6;
                      sVar45 = auVar63._4_2_;
                      auVar69._4_2_ =
                           (ushort)(sVar7 < sVar45) * sVar45 | (ushort)(sVar7 >= sVar45) * sVar7;
                      sVar45 = auVar63._6_2_;
                      auVar69._6_2_ =
                           (ushort)(sVar8 < sVar45) * sVar45 | (ushort)(sVar8 >= sVar45) * sVar8;
                      sVar45 = auVar63._8_2_;
                      auVar69._8_2_ =
                           (ushort)(sVar9 < sVar45) * sVar45 | (ushort)(sVar9 >= sVar45) * sVar9;
                      sVar45 = auVar63._10_2_;
                      auVar69._10_2_ =
                           (ushort)(sVar10 < sVar45) * sVar45 | (ushort)(sVar10 >= sVar45) * sVar10;
                      sVar45 = auVar63._12_2_;
                      auVar69._12_2_ =
                           (ushort)(sVar11 < sVar45) * sVar45 | (ushort)(sVar11 >= sVar45) * sVar11;
                      sVar45 = auVar63._14_2_;
                      auVar69._14_2_ =
                           (ushort)(sVar55 < sVar45) * sVar45 | (ushort)(sVar55 >= sVar45) * sVar55;
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar34) = auVar69;
                      sVar45 = auVar50._0_2_;
                      auVar47._0_2_ =
                           ((short)auVar69._0_2_ < sVar45) * auVar69._0_2_ |
                           (ushort)((short)auVar69._0_2_ >= sVar45) * sVar45;
                      sVar45 = auVar50._2_2_;
                      auVar47._2_2_ =
                           ((short)auVar69._2_2_ < sVar45) * auVar69._2_2_ |
                           (ushort)((short)auVar69._2_2_ >= sVar45) * sVar45;
                      sVar45 = auVar50._4_2_;
                      auVar47._4_2_ =
                           ((short)auVar69._4_2_ < sVar45) * auVar69._4_2_ |
                           (ushort)((short)auVar69._4_2_ >= sVar45) * sVar45;
                      sVar45 = auVar50._6_2_;
                      auVar47._6_2_ =
                           ((short)auVar69._6_2_ < sVar45) * auVar69._6_2_ |
                           (ushort)((short)auVar69._6_2_ >= sVar45) * sVar45;
                      sVar45 = auVar50._8_2_;
                      auVar47._8_2_ =
                           ((short)auVar69._8_2_ < sVar45) * auVar69._8_2_ |
                           (ushort)((short)auVar69._8_2_ >= sVar45) * sVar45;
                      sVar45 = auVar50._10_2_;
                      auVar47._10_2_ =
                           ((short)auVar69._10_2_ < sVar45) * auVar69._10_2_ |
                           (ushort)((short)auVar69._10_2_ >= sVar45) * sVar45;
                      sVar45 = auVar50._12_2_;
                      sVar48 = auVar50._14_2_;
                      auVar47._12_2_ =
                           ((short)auVar69._12_2_ < sVar45) * auVar69._12_2_ |
                           (ushort)((short)auVar69._12_2_ >= sVar45) * sVar45;
                      auVar47._14_2_ =
                           ((short)auVar69._14_2_ < sVar48) * auVar69._14_2_ |
                           (ushort)((short)auVar69._14_2_ >= sVar48) * sVar48;
                      sVar45 = auVar80._0_2_;
                      auVar49._0_2_ =
                           (sVar45 < (short)auVar69._0_2_) * auVar69._0_2_ |
                           (ushort)(sVar45 >= (short)auVar69._0_2_) * sVar45;
                      sVar45 = auVar80._2_2_;
                      auVar49._2_2_ =
                           (sVar45 < (short)auVar69._2_2_) * auVar69._2_2_ |
                           (ushort)(sVar45 >= (short)auVar69._2_2_) * sVar45;
                      sVar45 = auVar80._4_2_;
                      auVar49._4_2_ =
                           (sVar45 < (short)auVar69._4_2_) * auVar69._4_2_ |
                           (ushort)(sVar45 >= (short)auVar69._4_2_) * sVar45;
                      sVar45 = auVar80._6_2_;
                      auVar49._6_2_ =
                           (sVar45 < (short)auVar69._6_2_) * auVar69._6_2_ |
                           (ushort)(sVar45 >= (short)auVar69._6_2_) * sVar45;
                      sVar45 = auVar80._8_2_;
                      auVar49._8_2_ =
                           (sVar45 < (short)auVar69._8_2_) * auVar69._8_2_ |
                           (ushort)(sVar45 >= (short)auVar69._8_2_) * sVar45;
                      sVar45 = auVar80._10_2_;
                      auVar49._10_2_ =
                           (sVar45 < (short)auVar69._10_2_) * auVar69._10_2_ |
                           (ushort)(sVar45 >= (short)auVar69._10_2_) * sVar45;
                      sVar45 = auVar80._12_2_;
                      sVar48 = auVar80._14_2_;
                      auVar49._12_2_ =
                           (sVar45 < (short)auVar69._12_2_) * auVar69._12_2_ |
                           (ushort)(sVar45 >= (short)auVar69._12_2_) * sVar45;
                      auVar49._14_2_ =
                           (sVar48 < (short)auVar69._14_2_) * auVar69._14_2_ |
                           (ushort)(sVar48 >= (short)auVar69._14_2_) * sVar48;
                      piVar5 = ((ppVar19->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar32) = (int)(short)auVar69._0_2_;
                      *(int *)((long)piVar5 + lVar23 * 4 + lVar32) = (int)(short)auVar69._2_2_;
                      *(int *)((long)piVar5 + lVar23 * 8 + lVar32) = (int)(short)auVar69._4_2_;
                      *(int *)((long)piVar5 + lVar23 * 0xc + lVar32) = (int)(short)auVar69._6_2_;
                      *(int *)((long)piVar5 + lVar23 * 0x10 + lVar32) = (int)(short)auVar69._8_2_;
                      *(int *)((long)piVar5 + lVar23 * 0x14 + lVar32) = (int)(short)auVar69._10_2_;
                      *(int *)((long)piVar5 + lVar23 * 0x18 + lVar32) = (int)(short)auVar69._12_2_;
                      *(int *)((long)piVar5 + lVar23 * 0x1c + lVar32) = (int)(short)auVar69._14_2_;
                      auVar80 = psubsw(auVar69,auVar52);
                      auVar12._4_4_ = uVar41;
                      auVar12._0_4_ = uVar41;
                      auVar12._8_4_ = uVar41;
                      auVar12._12_4_ = uVar41;
                      auVar63 = psubsw(auVar63,auVar12);
                      auVar81._0_2_ = -(ushort)(auVar80._0_2_ < auVar63._0_2_);
                      auVar81._2_2_ = -(ushort)(auVar80._2_2_ < auVar63._2_2_);
                      auVar81._4_2_ = -(ushort)(auVar80._4_2_ < auVar63._4_2_);
                      auVar81._6_2_ = -(ushort)(auVar80._6_2_ < auVar63._6_2_);
                      auVar81._8_2_ = -(ushort)(auVar80._8_2_ < auVar63._8_2_);
                      auVar81._10_2_ = -(ushort)(auVar80._10_2_ < auVar63._10_2_);
                      auVar81._12_2_ = -(ushort)(auVar80._12_2_ < auVar63._12_2_);
                      auVar81._14_2_ = -(ushort)(auVar80._14_2_ < auVar63._14_2_);
                      if ((((((((((((((((auVar81 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar81 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar81 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar81 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar81 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar81 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar81 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar81 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar81 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar81 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar81 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar81 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar81 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar81 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar81._14_2_ >> 7 & 1) == 0) && (auVar81._14_2_ & 0x8000) == 0) break;
                      bVar39 = uVar21 < size;
                      lVar34 = lVar34 + 0x10;
                      lVar32 = lVar32 + uVar25 * 4;
                      uVar21 = uVar21 + 1;
                      auVar80 = auVar49;
                      auVar50 = auVar47;
                    } while (lVar33 != lVar34);
                  } while ((!bVar39) && (bVar39 = uVar28 < 7, uVar28 = uVar28 + 1, bVar39));
                  palVar20 = ptr_02 + (uint)(iVar14 % (int)uVar38);
                  sVar45 = (short)(*palVar20)[0];
                  sVar48 = *(short *)((long)*palVar20 + 2);
                  sVar6 = *(short *)((long)*palVar20 + 4);
                  sVar7 = *(short *)((long)*palVar20 + 6);
                  sVar8 = (short)(*palVar20)[1];
                  sVar9 = *(short *)((long)*palVar20 + 10);
                  sVar10 = *(short *)((long)*palVar20 + 0xc);
                  sVar11 = *(short *)((long)*palVar20 + 0xe);
                  sVar55 = auVar64._0_2_;
                  auVar70._0_2_ = -(ushort)(sVar55 < sVar45);
                  sVar51 = auVar64._2_2_;
                  auVar70._2_2_ = -(ushort)(sVar51 < sVar48);
                  sVar56 = auVar64._4_2_;
                  auVar70._4_2_ = -(ushort)(sVar56 < sVar6);
                  sVar57 = auVar64._6_2_;
                  auVar70._6_2_ = -(ushort)(sVar57 < sVar7);
                  sVar58 = auVar64._8_2_;
                  auVar70._8_2_ = -(ushort)(sVar58 < sVar8);
                  sVar59 = auVar64._10_2_;
                  auVar70._10_2_ = -(ushort)(sVar59 < sVar9);
                  sVar60 = auVar64._12_2_;
                  auVar70._12_2_ = -(ushort)(sVar60 < sVar10);
                  sVar61 = auVar64._14_2_;
                  auVar70._14_2_ = -(ushort)(sVar61 < sVar11);
                  auVar13._2_2_ = -(ushort)(sVar40 == 6);
                  auVar13._0_2_ = -(ushort)(sVar54 == 7);
                  auVar13._4_2_ = -(ushort)(sVar54 == 5);
                  auVar13._6_2_ = -(ushort)(sVar40 == 4);
                  auVar13._8_2_ = -(ushort)(sVar54 == 3);
                  auVar13._10_2_ = -(ushort)(sVar40 == 2);
                  auVar13._12_2_ = -(ushort)(sVar54 == 1);
                  auVar13._14_2_ = -(ushort)(sVar40 == 0);
                  auVar70 = auVar70 & auVar13;
                  auVar64._0_2_ =
                       (ushort)(sVar45 < sVar55) * sVar55 | (ushort)(sVar45 >= sVar55) * sVar45;
                  auVar64._2_2_ =
                       (ushort)(sVar48 < sVar51) * sVar51 | (ushort)(sVar48 >= sVar51) * sVar48;
                  auVar64._4_2_ =
                       (ushort)(sVar6 < sVar56) * sVar56 | (ushort)(sVar6 >= sVar56) * sVar6;
                  auVar64._6_2_ =
                       (ushort)(sVar7 < sVar57) * sVar57 | (ushort)(sVar7 >= sVar57) * sVar7;
                  auVar64._8_2_ =
                       (ushort)(sVar8 < sVar58) * sVar58 | (ushort)(sVar8 >= sVar58) * sVar8;
                  auVar64._10_2_ =
                       (ushort)(sVar9 < sVar59) * sVar59 | (ushort)(sVar9 >= sVar59) * sVar9;
                  auVar64._12_2_ =
                       (ushort)(sVar10 < sVar60) * sVar60 | (ushort)(sVar10 >= sVar60) * sVar10;
                  auVar64._14_2_ =
                       (ushort)(sVar11 < sVar61) * sVar61 | (ushort)(sVar11 >= sVar61) * sVar11;
                  if ((((((((((((((((auVar70 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar70 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar70 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar70 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar70 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar70 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar70 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar70 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar70 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar70 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar70 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar70 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar70 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar70[0xf] < '\0') {
                    local_11c = (int)uVar24;
                  }
                  uVar24 = uVar24 + 1;
                  lVar26 = lVar26 + 4;
                  palVar20 = ptr_02;
                  if (uVar24 == uVar31) {
                    if (s2_end != 0) {
                      if (iVar37 < 7) {
                        auVar43 = auVar64;
                        uVar28 = 1;
                        if (1 < (int)uVar22) {
                          uVar28 = uVar22;
                        }
                        do {
                          auVar65._0_8_ = auVar43._0_8_ << 0x10;
                          auVar65._8_8_ = auVar43._8_8_ << 0x10 | auVar43._0_8_ >> 0x30;
                          auVar64._14_2_ = auVar43._12_2_;
                          uVar28 = uVar28 - 1;
                          auVar43 = auVar65;
                        } while (uVar28 != 0);
                      }
                      uVar35 = (uint)auVar64._14_2_;
                    }
                    sVar54 = (short)uVar35;
                    iVar18 = iVar14;
                    if ((s1_end != 0) && ((uVar53 & 0x7ffffff8) != 0)) {
                      uVar25 = 0;
                      do {
                        iVar29 = ((uint)uVar25 & 7) * uVar38 + ((uint)(uVar25 >> 3) & 0x1fffffff);
                        if (iVar29 < (int)uVar17) {
                          auVar64._14_2_ = *(ushort *)((long)*ptr_02 + uVar25 * 2);
                          if ((short)(ushort)uVar35 < (short)auVar64._14_2_) {
                            uVar35 = (uint)auVar64._14_2_;
                            iVar18 = iVar29;
                            local_11c = iVar15;
                          }
                          else {
                            if (iVar18 <= iVar29) {
                              iVar29 = iVar18;
                            }
                            if (local_11c != iVar15) {
                              iVar29 = iVar18;
                            }
                            if (auVar64._14_2_ == (ushort)uVar35) {
                              iVar18 = iVar29;
                            }
                          }
                        }
                        sVar54 = (short)uVar35;
                        uVar25 = uVar25 + 1;
                      } while ((uVar38 & 0xfffffff) << 3 != (int)uVar25);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      uVar25 = ptr_02[(uint)(iVar14 % (int)uVar38)][0];
                      uVar53 = ptr_02[(uint)(iVar14 % (int)uVar38)][1];
                      if (iVar37 < 7) {
                        uVar17 = 1;
                        if (1 < (int)uVar22) {
                          uVar17 = uVar22;
                        }
                        do {
                          uVar53 = uVar53 << 0x10 | uVar25 >> 0x30;
                          uVar17 = uVar17 - 1;
                          uVar25 = uVar25 << 0x10;
                        } while (uVar17 != 0);
                      }
                      sVar54 = (short)(uVar53 >> 0x30);
                      iVar18 = iVar14;
                      local_11c = iVar15;
                    }
                    sVar40 = auVar42._0_2_;
                    auVar44._0_2_ = -(ushort)((short)auVar47._0_2_ < sVar40);
                    sVar45 = auVar42._2_2_;
                    auVar44._2_2_ = -(ushort)((short)auVar47._2_2_ < sVar45);
                    auVar44._4_2_ = -(ushort)((short)auVar47._4_2_ < sVar40);
                    auVar44._6_2_ = -(ushort)((short)auVar47._6_2_ < sVar45);
                    auVar44._8_2_ = -(ushort)((short)auVar47._8_2_ < sVar40);
                    auVar44._10_2_ = -(ushort)((short)auVar47._10_2_ < sVar45);
                    auVar44._12_2_ = -(ushort)((short)auVar47._12_2_ < sVar40);
                    auVar44._14_2_ = -(ushort)((short)auVar47._14_2_ < sVar45);
                    sVar40 = auVar46._0_2_;
                    auVar42._0_2_ = -(ushort)(sVar40 < (short)auVar49._0_2_);
                    sVar45 = auVar46._2_2_;
                    auVar42._2_2_ = -(ushort)(sVar45 < (short)auVar49._2_2_);
                    auVar42._4_2_ = -(ushort)(sVar40 < (short)auVar49._4_2_);
                    auVar42._6_2_ = -(ushort)(sVar45 < (short)auVar49._6_2_);
                    auVar42._8_2_ = -(ushort)(sVar40 < (short)auVar49._8_2_);
                    auVar42._10_2_ = -(ushort)(sVar45 < (short)auVar49._10_2_);
                    auVar42._12_2_ = -(ushort)(sVar40 < (short)auVar49._12_2_);
                    auVar42._14_2_ = -(ushort)(sVar45 < (short)auVar49._14_2_);
                    auVar42 = auVar42 | auVar44;
                    if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar42 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar42 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar42 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar42 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar42 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar42 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar42[0xf] < '\0') {
                      *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                      sVar54 = 0;
                      local_11c = 0;
                      iVar18 = 0;
                    }
                    ppVar19->score = (int)sVar54;
                    ppVar19->end_query = iVar18;
                    ppVar19->end_ref = local_11c;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar19;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}